

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,char code,bool ignore_zero)

{
  int iVar1;
  int num_args;
  NumericConstant NVar2;
  Expr arg;
  ExprBase EVar3;
  Reference RVar4;
  NumericExpr NVar5;
  undefined7 in_register_00000031;
  double value;
  BasicIteratedExprBuilder<mp::CallExpr> builder;
  BasicIteratedExprBuilder<mp::CallExpr> local_38;
  ArgList local_28;
  
  local_28.field_1.values_ = (Value *)&local_38;
  iVar1 = (int)CONCAT71(in_register_00000031,code);
  switch(iVar1) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    value = ReadConstant(this,code);
    if (value != 0.0 || !ignore_zero) {
      NVar2 = BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                        (&this->handler_->builder_->super_ExprFactory,value);
      return (NumericExpr)
             NVar2.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_;
    }
    break;
  case 0x6f:
    iVar1 = ReadOpCode(this);
    NVar5 = ReadNumericExpr(this,iVar1);
    return (NumericExpr)NVar5.super_ExprBase.impl_;
  case 0x76:
    RVar4 = DoReadReference(this);
    return (NumericExpr)
           RVar4.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  default:
    if (iVar1 == 0x66) {
      iVar1 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      num_args = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
      builder = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginCall
                          (this->handler_,iVar1,num_args);
      local_38.impl_ = builder.impl_;
      local_38.arg_index_ = builder.arg_index_;
      if (0 < num_args) {
        do {
          arg = ReadSymbolicExpr(this);
          BasicExprFactory<std::allocator<char>_>::BasicIteratedExprBuilder<mp::CallExpr>::AddArg
                    (&local_38,(Arg)arg.super_ExprBase.impl_);
          num_args = num_args + -1;
        } while (num_args != 0);
        builder.arg_index_ = local_38.arg_index_;
        builder.impl_ = local_38.impl_;
        builder._12_4_ = 0;
      }
      EVar3.impl_ = (Impl *)BasicExprFactory<std::allocator<char>_>::EndIterated<mp::CallExpr>
                                      (&this->handler_->builder_->super_ExprFactory,builder);
      return (NumericExpr)(ExprBase)EVar3.impl_;
    }
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
    local_38.impl_ = (Impl *)0x0;
    local_38.arg_index_ = 0;
    local_38._12_4_ = 0;
    local_28.types_ = 0;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x1724e2,&local_28);
  }
  return (NumericExpr)(Impl *)0x0;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}